

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

void free_engravings(level *lev)

{
  engr *peVar1;
  engr *__ptr;
  
  __ptr = lev->lev_engr;
  while (__ptr != (engr *)0x0) {
    peVar1 = __ptr->nxt_engr;
    free(__ptr);
    __ptr = peVar1;
  }
  lev->lev_engr = (engr *)0x0;
  return;
}

Assistant:

void free_engravings(struct level *lev)
{
	struct engr *ep2, *ep = lev->lev_engr;
	
	while (ep) {
	    ep2 = ep->nxt_engr;
	    dealloc_engr(ep);
	    ep = ep2;
	}
	lev->lev_engr = NULL;
}